

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_player_prop(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"type str type",parse_player_prop_type);
  parser_reg(p,"code str code",parse_player_prop_code);
  parser_reg(p,"desc str desc",parse_player_prop_desc);
  parser_reg(p,"name str desc",parse_player_prop_name);
  parser_reg(p,"value int value",parse_player_prop_value);
  parser_reg(p,"bindui sym ui int aux sym uival",parse_player_prop_bindui);
  return p;
}

Assistant:

static struct parser *init_parse_player_prop(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "type str type", parse_player_prop_type);
	parser_reg(p, "code str code", parse_player_prop_code);
	parser_reg(p, "desc str desc", parse_player_prop_desc);
	parser_reg(p, "name str desc", parse_player_prop_name);
	parser_reg(p, "value int value", parse_player_prop_value);
	parser_reg(p, "bindui sym ui int aux sym uival", parse_player_prop_bindui);
	return p;
}